

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_tan>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RDI;
  int iVar3;
  float fVar4;
  int iVar6;
  ulong uVar5;
  float fVar7;
  int iVar8;
  float fVar9;
  int iVar10;
  float fVar11;
  ulong uVar12;
  float fVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  float fVar18;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_tan op;
  Mat *m;
  __m128 ytan;
  __m128 _tmp;
  __m128 mask;
  __m128 eps;
  __m128 ycos;
  __m128 ysin;
  v4sf ysin1;
  v4sf ysin2;
  v4sf y2;
  v4sf z;
  v4sf sign_bit_cos;
  v4sf poly_mask;
  v4sf swap_sign_bit_sin;
  v4si emm4;
  v4si emm2;
  v4si emm0;
  v4sf y;
  v4sf sign_bit_sin;
  v4sf xmm3;
  v4sf xmm2;
  v4sf xmm1;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  int local_ab4;
  undefined8 local_ab0;
  undefined8 local_aa8;
  undefined8 local_aa0;
  undefined4 local_a98;
  long local_a90;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined8 local_a70;
  float *local_a68;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  int local_a48;
  undefined1 local_a41 [9];
  long *local_a38;
  undefined1 local_a2d;
  int local_a2c;
  undefined8 *local_a20;
  undefined8 *local_a18;
  undefined8 *local_a08;
  float *local_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  float *local_9e8;
  long local_9e0;
  undefined4 local_9d4;
  long local_9d0;
  float *local_9c8;
  undefined4 local_9bc;
  int local_9b8;
  int local_9b4;
  undefined8 *local_9b0;
  undefined4 local_9a4;
  long local_9a0;
  undefined8 *local_990;
  undefined8 *local_968;
  undefined1 *local_960;
  float *local_958;
  undefined1 *local_950;
  undefined1 local_948 [16];
  ulong local_938;
  ulong uStack_930;
  int local_928;
  int iStack_924;
  int iStack_920;
  int iStack_91c;
  undefined8 local_918;
  undefined8 uStack_910;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined1 local_8f8 [16];
  ulong local_8e8;
  ulong uStack_8e0;
  ulong local_8d8;
  ulong uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined4 local_8a8;
  undefined4 uStack_8a4;
  undefined4 uStack_8a0;
  undefined4 uStack_89c;
  undefined4 local_88c;
  undefined8 local_888;
  undefined8 uStack_880;
  ulong local_878;
  ulong uStack_870;
  ulong local_868;
  ulong uStack_860;
  ulong local_858;
  ulong uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  ulong local_828;
  ulong uStack_820;
  ulong local_818;
  ulong uStack_810;
  ulong local_808;
  ulong uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  ulong uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  ulong local_7b8;
  ulong uStack_7b0;
  ulong local_7a8;
  ulong uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  float *local_778;
  undefined1 *local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  ulong local_758;
  ulong uStack_750;
  ulong local_748;
  ulong uStack_740;
  ulong local_738;
  ulong uStack_730;
  ulong local_728;
  ulong uStack_720;
  ulong local_718;
  ulong uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  ulong local_6d8;
  ulong uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  ulong local_6b8;
  ulong uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  ulong local_698;
  ulong uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  ulong local_578;
  ulong uStack_570;
  ulong local_568;
  ulong uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 *local_530;
  float *local_528;
  float *local_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  float local_4f8 [2];
  float afStack_4f0 [2];
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float *local_470;
  float *local_468;
  undefined8 *local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  float local_438 [2];
  float afStack_430 [2];
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float *local_410;
  float *local_408;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  float local_3d8 [2];
  float afStack_3d0 [2];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float *local_3b0;
  float *local_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378 [2];
  float afStack_370 [2];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float *local_350;
  float *local_348;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318 [2];
  float afStack_310 [2];
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined8 *local_2f0;
  ulong *local_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1ac;
  undefined8 local_1a8;
  ulong uStack_1a0;
  undefined4 local_18c;
  undefined8 local_188;
  ulong uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ulong local_168;
  ulong uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  ulong uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  ulong uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  ulong uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_a48 = *(int *)((long)in_RDI + 0x2c);
  local_a4c = (int)in_RDI[6];
  local_a50 = *(int *)((long)in_RDI + 0x34);
  local_a54 = (int)in_RDI[7];
  local_a58 = (int)in_RDI[3];
  local_a5c = local_a48 * local_a4c * local_a50 * local_a58;
  local_a38 = in_RDI;
  for (local_a60 = 0; local_a60 < local_a54; local_a60 = local_a60 + 1) {
    local_a20 = &local_ab0;
    local_9b4 = *(int *)((long)local_a38 + 0x2c);
    local_9b8 = (int)local_a38[6];
    local_9bc = *(undefined4 *)((long)local_a38 + 0x34);
    local_9c8 = (float *)(*local_a38 + local_a38[8] * (long)local_a60 * local_a38[2]);
    local_9d0 = local_a38[2];
    local_9d4 = (undefined4)local_a38[3];
    local_9e0 = local_a38[4];
    local_9b0 = &local_ab0;
    local_9a0 = (long)local_9b4 * (long)local_9b8 * local_9d0;
    local_a18 = &local_ab0;
    local_a08 = &local_ab0;
    local_9a4 = 0x10;
    local_a2c = local_a60;
    local_a2d = 1;
    local_ab0 = 0;
    local_aa0 = 0;
    local_a98 = 0;
    local_a88 = 0;
    local_a84 = 0;
    local_a80 = 0;
    local_a7c = 0;
    local_a78 = 0;
    local_a70 = 0;
    local_aa8 = 0;
    local_a68 = local_9c8;
    for (local_ab4 = 0; local_990 = local_a08, local_a90 = local_9e0, local_ab4 + 3 < local_a5c;
        local_ab4 = local_ab4 + 4) {
      local_a00 = local_a68;
      local_8e8 = *(ulong *)local_a68;
      uStack_8e0 = *(ulong *)(local_a68 + 2);
      local_960 = local_a41;
      local_968 = &local_ac8;
      local_88c = 0x322bcc77;
      local_8a8 = 0x322bcc77;
      uStack_8a4 = 0x322bcc77;
      uStack_8a0 = 0x322bcc77;
      uStack_89c = 0x322bcc77;
      local_918 = 0x322bcc77322bcc77;
      uStack_910 = 0x322bcc77322bcc77;
      local_770 = local_8f8;
      local_778 = &local_908;
      local_688 = 0;
      uStack_680 = 0;
      local_6e8 = 0x7fffffff7fffffff;
      uStack_6e0 = 0x7fffffff7fffffff;
      local_1f8 = local_8e8 & 0x7fffffff7fffffff;
      uStack_1f0 = uStack_8e0 & 0x7fffffff7fffffff;
      local_708 = 0x8000000080000000;
      uStack_700 = 0x8000000080000000;
      local_78 = local_8e8 & 0x8000000080000000;
      uStack_70 = uStack_8e0 & 0x8000000080000000;
      local_5b8 = 0x3fa2f9833fa2f983;
      uStack_5b0 = 0x3fa2f9833fa2f983;
      local_5a8._0_4_ = (float)local_1f8;
      local_5a8._4_4_ = (float)(local_1f8 >> 0x20);
      uStack_5a0._0_4_ = (float)uStack_1f0;
      uStack_5a0._4_4_ = (float)(uStack_1f0 >> 0x20);
      local_7c8 = CONCAT44(local_5a8._4_4_ * 1.2732395,(float)local_5a8 * 1.2732395);
      uStack_7c0 = CONCAT44(uStack_5a0._4_4_ * 1.2732395,(float)uStack_5a0 * 1.2732395);
      local_648 = local_7c8;
      uStack_640 = uStack_7c0;
      iVar3 = (int)((float)local_5a8 * 1.2732395);
      iVar6 = (int)(local_5a8._4_4_ * 1.2732395);
      iVar8 = (int)((float)uStack_5a0 * 1.2732395);
      iVar10 = (int)(uStack_5a0._4_4_ * 1.2732395);
      local_7e8 = CONCAT44(iVar6,iVar3);
      uStack_7e0 = CONCAT44(iVar10,iVar8);
      local_1c8 = local_7e8;
      uStack_1c0 = uStack_7e0;
      local_1d8 = 0x100000001;
      uStack_1d0 = 0x100000001;
      local_7e8 = CONCAT44(iVar6 + 1,iVar3 + 1);
      uStack_7e0 = CONCAT44(iVar10 + 1,iVar8 + 1);
      local_108 = local_7e8;
      uStack_100 = uStack_7e0;
      local_118 = 0xfffffffefffffffe;
      uStack_110 = 0xfffffffefffffffe;
      local_168 = local_7e8 & 0xfffffffefffffffe;
      uStack_160 = uStack_7e0 & 0xfffffffefffffffe;
      local_658._0_4_ = (int)local_168;
      local_658._4_4_ = (int)(local_168 >> 0x20);
      uStack_650._0_4_ = (int)uStack_160;
      uStack_650._4_4_ = (int)(uStack_160 >> 0x20);
      local_2a8 = (float)(int)local_658;
      fStack_2a4 = (float)local_658._4_4_;
      fStack_2a0 = (float)(int)uStack_650;
      fStack_29c = (float)uStack_650._4_4_;
      local_7c8 = CONCAT44(fStack_2a4,local_2a8);
      uStack_7c0 = CONCAT44(fStack_29c,fStack_2a0);
      local_138 = 0x400000004;
      uStack_130 = 0x400000004;
      uVar12 = local_7e8 & 0x400000004;
      uStack_800 = uStack_7e0 & 0x400000004;
      local_18c = 0x1d;
      local_188._0_4_ = (int)uVar12;
      local_188._4_4_ = (undefined4)(uVar12 >> 0x20);
      local_7d8 = CONCAT44(local_188._4_4_,(int)local_188 << 0x1d);
      local_738 = local_7d8;
      local_808 = local_7d8;
      local_158 = 0x200000002;
      uStack_150 = 0x200000002;
      uVar14 = local_7e8 & 0x200000002;
      uVar17 = uStack_7e0 & 0x200000002;
      local_d8 = 0;
      uStack_d0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_e8._0_4_ = (int)uVar14;
      local_e8._4_4_ = (int)(uVar14 >> 0x20);
      uStack_e0._0_4_ = (int)uVar17;
      uStack_e0._4_4_ = (int)(uVar17 >> 0x20);
      local_7e8 = CONCAT44(-(uint)(local_e8._4_4_ == 0),-(uint)((int)local_e8 == 0));
      uStack_7e0 = CONCAT44(-(uint)(uStack_e0._4_4_ == 0),-(uint)((int)uStack_e0 == 0));
      local_748 = local_7e8;
      uStack_740 = uStack_7e0;
      local_818 = local_7e8;
      uStack_810 = uStack_7e0;
      local_530 = &local_7c8;
      local_228 = &local_788;
      local_4d0 = &local_768;
      local_208 = local_7c8;
      uStack_200 = uStack_7c0;
      local_218 = 0xbf490000bf490000;
      uStack_210 = 0xbf490000bf490000;
      local_1e8 = local_2a8 * -0.78515625;
      fStack_1e4 = fStack_2a4 * -0.78515625;
      fStack_1e0 = fStack_2a0 * -0.78515625;
      fStack_1dc = fStack_29c * -0.78515625;
      local_768 = CONCAT44(fStack_1e4 + local_5a8._4_4_,local_1e8 + (float)local_5a8);
      uStack_760 = CONCAT44(fStack_1dc + uStack_5a0._4_4_,fStack_1e0 + (float)uStack_5a0);
      local_288 = &local_798;
      local_268 = local_7c8;
      uStack_260 = uStack_7c0;
      local_278 = 0xb97da000b97da000;
      uStack_270 = 0xb97da000b97da000;
      local_248 = local_2a8 * -0.00024187565;
      fStack_244 = fStack_2a4 * -0.00024187565;
      fStack_240 = fStack_2a0 * -0.00024187565;
      fStack_23c = fStack_29c * -0.00024187565;
      local_258 = local_768;
      uStack_250 = uStack_760;
      fVar13 = local_248 + local_1e8 + (float)local_5a8;
      fVar15 = fStack_244 + fStack_1e4 + local_5a8._4_4_;
      fVar16 = fStack_240 + fStack_1e0 + (float)uStack_5a0;
      fVar18 = fStack_23c + fStack_1dc + uStack_5a0._4_4_;
      local_768 = CONCAT44(fVar15,fVar13);
      uStack_760 = CONCAT44(fVar18,fVar16);
      local_2e8 = &local_7a8;
      local_2c8 = local_7c8;
      uStack_2c0 = uStack_7c0;
      local_2d8 = 0xb3222169b3222169;
      uStack_2d0 = 0xb3222169b3222169;
      local_2a8 = local_2a8 * -3.774895e-08;
      fStack_2a4 = fStack_2a4 * -3.774895e-08;
      fStack_2a0 = fStack_2a0 * -3.774895e-08;
      fStack_29c = fStack_29c * -3.774895e-08;
      local_2b8 = local_768;
      uStack_2b0 = uStack_760;
      fVar13 = local_2a8 + fVar13;
      fVar15 = fStack_2a4 + fVar15;
      fVar16 = fStack_2a0 + fVar16;
      fVar18 = fStack_29c + fVar18;
      local_768 = CONCAT44(fVar15,fVar13);
      uStack_760 = CONCAT44(fVar18,fVar16);
      local_178 = 0x200000002;
      uStack_170 = 0x200000002;
      local_7f8 = CONCAT44(local_658._4_4_ + -2,(int)local_658 + -2);
      uStack_7f0 = CONCAT44(uStack_650._4_4_ + -2,(int)uStack_650 + -2);
      local_58 = local_7f8;
      uStack_50 = uStack_7f0;
      local_68 = 0x400000004;
      uStack_60 = 0x400000004;
      uVar5 = ~local_7f8 & 0x400000004;
      uStack_820 = ~uStack_7f0 & 0x400000004;
      local_1ac = 0x1d;
      local_1a8._0_4_ = (int)uVar5;
      local_1a8._4_4_ = (undefined4)(uVar5 >> 0x20);
      local_7f8 = CONCAT44(local_1a8._4_4_,(int)local_1a8 << 0x1d);
      local_758 = local_7f8;
      local_828 = local_7f8;
      local_88 = local_7d8;
      local_7b8 = local_78 ^ local_7d8;
      uStack_7b0 = uStack_70 ^ uStack_800;
      local_5c8 = local_768;
      uStack_5c0 = uStack_760;
      local_5d8 = local_768;
      uStack_5d0 = uStack_760;
      local_838 = fVar13 * fVar13;
      fStack_834 = fVar15 * fVar15;
      fStack_830 = fVar16 * fVar16;
      fStack_82c = fVar18 * fVar18;
      local_520 = &local_838;
      local_350 = _ps_coscof_p1;
      local_328 = 0x37ccf5ce37ccf5ce;
      uStack_320 = 0x37ccf5ce37ccf5ce;
      local_338 = CONCAT44(fStack_834,local_838);
      uStack_330 = CONCAT44(fStack_82c,fStack_830);
      local_308 = local_838 * 2.4433157e-05;
      fStack_304 = fStack_834 * 2.4433157e-05;
      fStack_300 = fStack_830 * 2.4433157e-05;
      fStack_2fc = fStack_82c * 2.4433157e-05;
      local_318[0] = -0.0013887316;
      local_318[1] = -0.0013887316;
      afStack_310[0] = -0.0013887316;
      afStack_310[1] = -0.0013887316;
      local_7c8 = CONCAT44(fStack_304 + -0.0013887316,local_308 + -0.0013887316);
      uStack_7c0 = CONCAT44(fStack_2fc + -0.0013887316,fStack_300 + -0.0013887316);
      local_3b0 = _ps_coscof_p2;
      local_388 = local_7c8;
      uStack_380 = uStack_7c0;
      local_398 = CONCAT44(fStack_834,local_838);
      uStack_390 = CONCAT44(fStack_82c,fStack_830);
      local_368 = (local_308 + -0.0013887316) * local_838;
      fStack_364 = (fStack_304 + -0.0013887316) * fStack_834;
      fStack_360 = (fStack_300 + -0.0013887316) * fStack_830;
      fStack_35c = (fStack_2fc + -0.0013887316) * fStack_82c;
      local_378[0] = 0.041666646;
      local_378[1] = 0.041666646;
      afStack_370[0] = 0.041666646;
      afStack_370[1] = 0.041666646;
      local_7c8 = CONCAT44(fStack_364 + 0.041666646,local_368 + 0.041666646);
      uStack_7c0 = CONCAT44(fStack_35c + 0.041666646,fStack_360 + 0.041666646);
      local_5f8 = CONCAT44(fStack_834,local_838);
      uStack_5f0 = CONCAT44(fStack_82c,fStack_830);
      local_5e8 = local_7c8;
      uStack_5e0 = uStack_7c0;
      fVar4 = (local_368 + 0.041666646) * local_838;
      fVar7 = (fStack_364 + 0.041666646) * fStack_834;
      fVar9 = (fStack_360 + 0.041666646) * fStack_830;
      fVar11 = (fStack_35c + 0.041666646) * fStack_82c;
      local_7c8 = CONCAT44(fVar7,fVar4);
      uStack_7c0 = CONCAT44(fVar11,fVar9);
      local_618 = CONCAT44(fStack_834,local_838);
      uStack_610 = CONCAT44(fStack_82c,fStack_830);
      local_608 = local_7c8;
      uStack_600 = uStack_7c0;
      fVar4 = fVar4 * local_838;
      fVar7 = fVar7 * fStack_834;
      fVar9 = fVar9 * fStack_830;
      fVar11 = fVar11 * fStack_82c;
      local_7c8 = CONCAT44(fVar7,fVar4);
      uStack_7c0 = CONCAT44(fVar11,fVar9);
      local_528 = ::_ps_0p5;
      local_508 = local_7c8;
      uStack_500 = uStack_7c0;
      local_4e8 = CONCAT44(fStack_834,local_838);
      uStack_4e0 = CONCAT44(fStack_82c,fStack_830);
      local_4f8[0] = 0.5;
      local_4f8[1] = 0.5;
      afStack_4f0[0] = 0.5;
      afStack_4f0[1] = 0.5;
      local_518 = local_838 * 0.5;
      fStack_514 = fStack_834 * 0.5;
      fStack_510 = fStack_830 * 0.5;
      fStack_50c = fStack_82c * 0.5;
      fVar4 = fVar4 - local_518;
      fVar7 = fVar7 - fStack_514;
      fVar9 = fVar9 - fStack_510;
      fVar11 = fVar11 - fStack_50c;
      local_7c8 = CONCAT44(fVar7,fVar4);
      uStack_7c0 = CONCAT44(fVar11,fVar9);
      local_548 = local_7c8;
      uStack_540 = uStack_7c0;
      local_558 = 0x3f8000003f800000;
      uStack_550 = 0x3f8000003f800000;
      fVar4 = fVar4 + 1.0;
      fVar7 = fVar7 + 1.0;
      fVar9 = fVar9 + 1.0;
      fVar11 = fVar11 + 1.0;
      local_7c8 = CONCAT44(fVar7,fVar4);
      uStack_7c0 = CONCAT44(fVar11,fVar9);
      local_4c0 = &local_848;
      local_410 = _ps_sincof_p1;
      local_3e8 = 0xb94ca1f9b94ca1f9;
      uStack_3e0 = 0xb94ca1f9b94ca1f9;
      local_3f8 = CONCAT44(fStack_834,local_838);
      uStack_3f0 = CONCAT44(fStack_82c,fStack_830);
      local_3c8 = local_838 * -0.00019515296;
      fStack_3c4 = fStack_834 * -0.00019515296;
      fStack_3c0 = fStack_830 * -0.00019515296;
      fStack_3bc = fStack_82c * -0.00019515296;
      local_3d8[0] = 0.008332161;
      local_3d8[1] = 0.008332161;
      afStack_3d0[0] = 0.008332161;
      afStack_3d0[1] = 0.008332161;
      local_848 = CONCAT44(fStack_3c4 + 0.008332161,local_3c8 + 0.008332161);
      uStack_840 = CONCAT44(fStack_3bc + 0.008332161,fStack_3c0 + 0.008332161);
      local_470 = _ps_sincof_p2;
      local_448 = local_848;
      uStack_440 = uStack_840;
      local_458 = CONCAT44(fStack_834,local_838);
      uStack_450 = CONCAT44(fStack_82c,fStack_830);
      local_428 = (local_3c8 + 0.008332161) * local_838;
      fStack_424 = (fStack_3c4 + 0.008332161) * fStack_834;
      fStack_420 = (fStack_3c0 + 0.008332161) * fStack_830;
      fStack_41c = (fStack_3bc + 0.008332161) * fStack_82c;
      local_438[0] = -0.16666655;
      local_438[1] = -0.16666655;
      afStack_430[0] = -0.16666655;
      afStack_430[1] = -0.16666655;
      local_848 = CONCAT44(fStack_424 + -0.16666655,local_428 + -0.16666655);
      uStack_840 = CONCAT44(fStack_41c + -0.16666655,fStack_420 + -0.16666655);
      local_638 = CONCAT44(fStack_834,local_838);
      uStack_630 = CONCAT44(fStack_82c,fStack_830);
      local_628 = local_848;
      uStack_620 = uStack_840;
      local_488 = (local_428 + -0.16666655) * local_838;
      fStack_484 = (fStack_424 + -0.16666655) * fStack_834;
      fStack_480 = (fStack_420 + -0.16666655) * fStack_830;
      fStack_47c = (fStack_41c + -0.16666655) * fStack_82c;
      local_848 = CONCAT44(fStack_484,local_488);
      uStack_840 = CONCAT44(fStack_47c,fStack_480);
      local_4a8 = local_848;
      uStack_4a0 = uStack_840;
      local_4b8 = local_768;
      uStack_4b0 = uStack_760;
      local_488 = local_488 * fVar13;
      fStack_484 = fStack_484 * fVar15;
      fStack_480 = fStack_480 * fVar16;
      fStack_47c = fStack_47c * fVar18;
      local_498 = local_768;
      uStack_490 = uStack_760;
      local_848 = CONCAT44(fStack_484 + fVar15,local_488 + fVar13);
      uStack_840 = CONCAT44(fStack_47c + fVar18,fStack_480 + fVar16);
      local_7a8 = local_7e8;
      uStack_7a0 = uStack_7e0;
      local_718 = local_7e8;
      uStack_710 = uStack_7e0;
      local_728 = local_848;
      uStack_720 = uStack_840;
      local_858 = local_7e8 & local_848;
      uStack_850 = uStack_7e0 & uStack_840;
      local_668 = local_7e8;
      uStack_660 = uStack_7e0;
      local_678 = local_7c8;
      uStack_670 = uStack_7c0;
      local_868 = ~local_7e8 & local_7c8;
      uStack_860 = ~uStack_7e0 & uStack_7c0;
      local_698 = local_848;
      uStack_690 = uStack_840;
      local_6a8._0_4_ = (float)local_858;
      local_6a8._4_4_ = (float)(local_858 >> 0x20);
      uStack_6a0._0_4_ = (float)uStack_850;
      uStack_6a0._4_4_ = (float)(uStack_850 >> 0x20);
      fVar13 = (local_488 + fVar13) - (float)local_6a8;
      fVar15 = (fStack_484 + fVar15) - local_6a8._4_4_;
      fVar16 = (fStack_480 + fVar16) - (float)uStack_6a0;
      fVar18 = (fStack_47c + fVar18) - uStack_6a0._4_4_;
      local_848 = CONCAT44(fVar15,fVar13);
      uStack_840 = CONCAT44(fVar18,fVar16);
      local_6b8 = local_7c8;
      uStack_6b0 = uStack_7c0;
      local_6c8._0_4_ = (float)local_868;
      local_6c8._4_4_ = (float)(local_868 >> 0x20);
      uStack_6c0._0_4_ = (float)uStack_860;
      uStack_6c0._4_4_ = (float)(uStack_860 >> 0x20);
      fVar4 = fVar4 - (float)local_6c8;
      fVar7 = fVar7 - local_6c8._4_4_;
      fVar9 = fVar9 - (float)uStack_6c0;
      fVar11 = fVar11 - uStack_6c0._4_4_;
      local_7c8 = CONCAT44(fVar7,fVar4);
      uStack_7c0 = CONCAT44(fVar11,fVar9);
      local_788 = CONCAT44(local_6c8._4_4_ + local_6a8._4_4_,(float)local_6c8 + (float)local_6a8);
      uStack_780 = CONCAT44(uStack_6c0._4_4_ + uStack_6a0._4_4_,
                            (float)uStack_6c0 + (float)uStack_6a0);
      local_588 = local_7c8;
      uStack_580 = uStack_7c0;
      local_598 = local_848;
      uStack_590 = uStack_840;
      local_798 = CONCAT44(fVar7 + fVar15,fVar4 + fVar13);
      uStack_790 = CONCAT44(fVar11 + fVar18,fVar9 + fVar16);
      local_98 = local_788;
      uStack_90 = uStack_780;
      local_b8 = local_798;
      uStack_b0 = uStack_790;
      local_c8 = local_7f8;
      local_878 = local_798 ^ local_7f8;
      uStack_870 = uStack_790 ^ uStack_820;
      fStack_904 = (float)(local_878 >> 0x20);
      local_908 = (float)local_878;
      fStack_8fc = (float)(uStack_870 >> 0x20);
      fStack_900 = (float)uStack_870;
      local_8b8 = 0;
      uStack_8b0 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_928 = -(uint)(local_908 == 0.0);
      iStack_924 = -(uint)(fStack_904 == 0.0);
      iStack_920 = -(uint)(fStack_900 == 0.0);
      iStack_91c = -(uint)(fStack_8fc == 0.0);
      local_8c8 = 0x322bcc77322bcc77;
      uStack_8c0 = 0x322bcc77322bcc77;
      local_8d8 = CONCAT44(iStack_924,local_928);
      uStack_8d0 = CONCAT44(iStack_91c,iStack_920);
      local_938 = local_8d8 & 0x322bcc77322bcc77;
      uStack_930 = uStack_8d0 & 0x322bcc77322bcc77;
      local_888._0_4_ = (float)local_938;
      local_888._4_4_ = (float)(local_938 >> 0x20);
      uStack_880._0_4_ = (float)uStack_930;
      uStack_880._4_4_ = (float)(uStack_930 >> 0x20);
      local_908 = local_908 + (float)local_888;
      fStack_904 = fStack_904 + local_888._4_4_;
      fStack_900 = fStack_900 + (float)uStack_880;
      fStack_8fc = fStack_8fc + uStack_880._4_4_;
      local_28 = CONCAT44(fStack_904,local_908);
      uStack_20 = CONCAT44(fStack_8fc,fStack_900);
      auVar2._8_8_ = uStack_780 ^ uStack_7b0;
      auVar2._0_8_ = local_788 ^ local_7b8;
      auVar1._8_8_ = uStack_20;
      auVar1._0_8_ = local_28;
      local_948 = divps(auVar2,auVar1);
      local_ac8 = local_948._0_8_;
      uStack_ac0 = local_948._8_8_;
      local_9e8 = local_a68;
      local_9f8._0_4_ = local_948._0_4_;
      local_9f8._4_4_ = local_948._4_4_;
      uStack_9f0._0_4_ = local_948._8_4_;
      uStack_9f0._4_4_ = local_948._12_4_;
      *local_a68 = (float)local_9f8;
      local_a68[1] = local_9f8._4_4_;
      local_a68[2] = (float)uStack_9f0;
      local_a68[3] = uStack_9f0._4_4_;
      local_a68 = local_a68 + 4;
      local_9f8 = local_948._0_8_;
      uStack_9f0 = local_948._8_8_;
      local_888 = local_938;
      uStack_880 = uStack_930;
      uStack_7f0 = uStack_820;
      uStack_7d0 = uStack_800;
      uStack_750 = uStack_820;
      uStack_730 = uStack_800;
      local_6f8 = local_8e8;
      uStack_6f0 = uStack_8e0;
      local_6d8 = local_8e8;
      uStack_6d0 = uStack_8e0;
      local_6c8 = local_868;
      uStack_6c0 = uStack_860;
      local_6a8 = local_858;
      uStack_6a0 = uStack_850;
      local_658 = local_168;
      uStack_650 = uStack_160;
      local_5a8 = local_1f8;
      uStack_5a0 = uStack_1f0;
      local_578 = local_858;
      uStack_570 = uStack_850;
      local_568 = local_868;
      uStack_560 = uStack_860;
      local_4c8 = local_4d0;
      local_468 = local_520;
      local_460 = local_4c0;
      local_408 = local_520;
      local_400 = local_4c0;
      local_3a8 = local_520;
      local_3a0 = local_530;
      local_348 = local_520;
      local_340 = local_530;
      local_2f0 = local_4d0;
      local_2e0 = local_530;
      local_290 = local_4d0;
      local_280 = local_530;
      local_230 = local_4d0;
      local_220 = local_530;
      local_1a8 = uVar5;
      uStack_1a0 = uStack_820;
      local_188 = uVar12;
      uStack_180 = uStack_800;
      local_148 = local_168;
      uStack_140 = uStack_160;
      local_128 = local_168;
      uStack_120 = uStack_160;
      local_e8 = uVar14;
      uStack_e0 = uVar17;
      uStack_c0 = uStack_820;
      local_a8 = local_7b8;
      uStack_a0 = uStack_7b0;
      uStack_80 = uStack_800;
      local_38 = local_878;
      uStack_30 = uStack_870;
    }
    for (; local_ab4 < local_a5c; local_ab4 = local_ab4 + 1) {
      local_950 = local_a41;
      local_958 = local_a68;
      fVar13 = tanf(*local_a68);
      *local_a68 = fVar13;
      local_a68 = local_a68 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}